

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O1

size_t MAFSA_automaton_enumerate_int_pair
                 (MAFSA_automaton ma,MAFSA_letter *l,size_t sz_l,MAFSA_letter *tmp,size_t sz_tmp,
                 MAFSA_letter delim,int *out,size_t sz_out)

{
  str_inner_params str;
  
  str.processed = 0;
  str.data = out;
  str.data_sz = sz_out;
  str.delim = delim;
  MAFSA_automaton_enumerate_ints(ma,l,sz_l,tmp,sz_tmp,delim,&str,MAFSA_str_to_int_pair);
  return (long)str.processed;
}

Assistant:

extern size_t MAFSA_automaton_enumerate_int_pair(MAFSA_automaton ma, const MAFSA_letter *l, size_t sz_l,
    MAFSA_letter *tmp, size_t sz_tmp, MAFSA_letter delim, int *out, size_t sz_out)
{
    struct str_inner_params str;

    str.delim     = delim;
    str.processed = 0;
    str.data      = out;
    str.data_sz   = sz_out;

    MAFSA_automaton_enumerate_ints(ma, l, sz_l, tmp, sz_tmp,
        delim, &str, MAFSA_str_to_int_pair);

    return str.processed;
}